

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O2

size_t __thiscall
asio::detail::epoll_reactor::
cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,size_t max_cancelled)

{
  size_t sVar1;
  scoped_lock lock;
  op_queue<asio::detail::scheduler_operation> ops;
  scoped_lock<asio::detail::posix_mutex> local_48;
  op_queue<asio::detail::scheduler_operation> local_38;
  
  local_48.mutex_ = &this->mutex_;
  pthread_mutex_lock((pthread_mutex_t *)local_48.mutex_);
  local_48.locked_ = true;
  local_38.front_ = (scheduler_operation *)0x0;
  local_38.back_ = (scheduler_operation *)0x0;
  sVar1 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel_timer(queue,timer,&local_38,max_cancelled);
  scoped_lock<asio::detail::posix_mutex>::unlock(&local_48);
  scheduler::post_deferred_completions(this->scheduler_,&local_38);
  op_queue<asio::detail::scheduler_operation>::~op_queue(&local_38);
  scoped_lock<asio::detail::posix_mutex>::~scoped_lock(&local_48);
  return sVar1;
}

Assistant:

std::size_t epoll_reactor::cancel_timer(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data& timer,
    std::size_t max_cancelled)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  std::size_t n = queue.cancel_timer(timer, ops, max_cancelled);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
  return n;
}